

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::WrapNAry
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view prefix,string_view postfix,Precedence precedence)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *__x;
  pointer pVVar1;
  ulong uVar2;
  const_iterator __position;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  Value *child_1;
  long lVar6;
  pointer pVVar7;
  ulong uVar8;
  size_t sVar9;
  Value *child;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *__range2;
  ulong uVar10;
  bool bVar11;
  string_view first_indent;
  string s;
  string_view local_a0;
  size_t local_90;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  
  local_a0.size_ = prefix.size_;
  local_a0.data_ = prefix.data_;
  pVVar1 = (args->
           super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0;
  bVar11 = false;
  lVar6 = 0;
  local_90 = local_a0.size_;
  for (pVVar7 = (args->
                super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                )._M_impl.super__Vector_impl_data._M_start; pVVar7 != pVVar1; pVVar7 = pVVar7 + 1) {
    sVar4 = Value::width(pVVar7);
    if (uVar8 <= sVar4) {
      uVar8 = sVar4;
    }
    bVar3 = !bVar11;
    bVar11 = true;
    if (bVar3) {
      bVar11 = 0x20 < (ulong)((long)(pVVar7->v).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pVVar7->v).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar6 = lVar6 + sVar4;
  }
  if ((bVar11) ||
     ((this->target_exp_width <= lVar6 + local_90 + postfix.size_ &&
      ((args->super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>)
       ._M_impl.super__Vector_impl_data._M_start !=
       (args->super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>)
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_88);
    __return_storage_ptr__->precedence = precedence;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
    uVar8 = uVar8 + local_a0.size_;
    uVar2 = this->target_exp_width;
    pVVar1 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar10 = 0;
    for (pVVar7 = (args->
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  )._M_impl.super__Vector_impl_data._M_start; pVVar7 != pVVar1; pVVar7 = pVVar7 + 1)
    {
      sVar4 = local_a0.size_;
      if (uVar2 <= uVar8) {
        sVar4 = this->indent_amount;
      }
      pcVar5 = local_a0.data_;
      sVar9 = local_a0.size_;
      if (uVar10 != 0 || uVar2 <= uVar8) {
        pcVar5 = (char *)0x0;
        sVar9 = 0;
      }
      first_indent.size_ = sVar9;
      first_indent.data_ = pcVar5;
      IndentValue(this,pVVar7,sVar4,first_indent);
      if (uVar10 < ((long)(args->
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        std::__cxx11::string::append
                  ((char *)((pVVar7->v).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1));
      }
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((pVVar7->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pVVar7->v).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__return_storage_ptr__);
      uVar10 = uVar10 + 1;
    }
    if (uVar2 <= uVar8) {
      __position._M_current =
           (__return_storage_ptr__->v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      string_view::operator_cast_to_string((string *)local_88,&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&__return_storage_ptr__->v,__position,(string *)local_88);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append
              ((char *)((__return_storage_ptr__->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)postfix.data_);
  }
  else {
    string_view::operator_cast_to_string((string *)local_88,&local_a0);
    pVVar1 = (args->
             super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pVVar7 = (args->
                  super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                  )._M_impl.super__Vector_impl_data._M_start; pVVar7 != pVVar1; pVVar7 = pVVar7 + 1)
    {
      if (pVVar7 != (args->
                    super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                    )._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)local_88);
      }
      std::__cxx11::string::append((string *)local_88);
    }
    std::__cxx11::string::append(local_88,(ulong)postfix.data_);
    local_68._8_8_ = local_88._8_8_;
    local_68._M_allocated_capacity = (size_type)local_58;
    if ((pointer)local_88._0_8_ == (pointer)(local_88 + 0x10)) {
      local_58._8_8_ = local_88._24_8_;
    }
    else {
      local_68._M_allocated_capacity = local_88._0_8_;
    }
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = local_88._16_8_ & 0xffffffffffffff00;
    __x = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_58 + 0x10);
    local_48._M_allocated_capacity = 0;
    local_48._8_8_ = 0;
    local_38 = 0;
    local_88._0_8_ = (pointer)(local_88 + 0x10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>(__x,&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->v,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__x);
    __return_storage_ptr__->precedence = precedence;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__x);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

Value WrapNAry(std::vector<Value>& args, string_view prefix,
                 string_view postfix, Precedence precedence) {
    size_t total_width = 0;
    size_t max_width = 0;
    bool multiline = false;
    for (auto& child : args) {
      auto w = child.width();
      max_width = std::max(max_width, w);
      total_width += w;
      multiline = multiline || child.v.size() > 1;
    }
    if (!multiline &&
        (total_width + prefix.size() + postfix.size() < target_exp_width ||
         args.empty())) {
      // Single line.
      auto s = std::string(prefix);
      for (auto& child : args) {
        if (&child != &args[0])
          s += ", ";
        s += child.v[0];
      }
      s += postfix;
      return Value{{std::move(s)}, precedence};
    } else {
      // Multi-line.
      Value ml { {}, precedence };
      auto ident_with_name = max_width + prefix.size() < target_exp_width;
      size_t i = 0;
      for (auto& child : args) {
        IndentValue(child, ident_with_name ? prefix.size() : indent_amount,
                    !i && ident_with_name ? prefix : string_view {});
        if (i < args.size() - 1) child.v.back() += ",";
        std::move(child.v.begin(), child.v.end(),
                  std::back_inserter(ml.v));
        i++;
      }
      if (!ident_with_name) ml.v.insert(ml.v.begin(), std::string(prefix));
      ml.v.back() += postfix;
      return ml;
    }
  }